

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor *
ggml_view_3d(ggml_context *ctx,ggml_tensor *a,int64_t ne0,int64_t ne1,int64_t ne2,size_t nb1,
            size_t nb2,size_t offset)

{
  ggml_tensor *pgVar1;
  int64_t local_38;
  int64_t local_30;
  int64_t local_28;
  
  local_38 = ne0;
  local_30 = ne1;
  local_28 = ne2;
  pgVar1 = ggml_view_impl(ctx,a,3,&local_38,offset);
  pgVar1->nb[1] = nb1;
  pgVar1->nb[2] = nb2;
  pgVar1->nb[3] = nb2 * ne2;
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_view_3d(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        int64_t               ne0,
        int64_t               ne1,
        int64_t               ne2,
        size_t                nb1,
        size_t                nb2,
        size_t                offset) {
    const int64_t ne[3] = { ne0, ne1, ne2 };

    struct ggml_tensor * result = ggml_view_impl(ctx, a, 3, ne, offset);

    result->nb[1] = nb1;
    result->nb[2] = nb2;
    result->nb[3] = result->nb[2]*ne2;

    return result;
}